

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_set_xquad(secp256k1_ge *r,secp256k1_fe *x)

{
  int iVar1;
  undefined1 local_68 [8];
  secp256k1_fe x3;
  secp256k1_fe x2;
  secp256k1_fe *x_local;
  secp256k1_ge *r_local;
  
  memcpy(r,x,0x28);
  secp256k1_fe_sqr((secp256k1_fe *)(x3.n + 4),x);
  secp256k1_fe_mul((secp256k1_fe *)local_68,x,(secp256k1_fe *)(x3.n + 4));
  r->infinity = 0;
  secp256k1_fe_add((secp256k1_fe *)local_68,&secp256k1_fe_const_b);
  iVar1 = secp256k1_fe_sqrt(&r->y,(secp256k1_fe *)local_68);
  return iVar1;
}

Assistant:

static int secp256k1_ge_set_xquad(secp256k1_ge *r, const secp256k1_fe *x) {
    secp256k1_fe x2, x3;
    r->x = *x;
    secp256k1_fe_sqr(&x2, x);
    secp256k1_fe_mul(&x3, x, &x2);
    r->infinity = 0;
    secp256k1_fe_add(&x3, &secp256k1_fe_const_b);
    return secp256k1_fe_sqrt(&r->y, &x3);
}